

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1294::run(TestCase1294 *this)

{
  SourceLocation location;
  bool bVar1;
  bool local_159;
  DebugExpression<bool_&> DStack_158;
  bool _kj_shouldLog_1;
  DebugExpression<bool_&> _kjCondition_1;
  SourceLocation local_148;
  Promise<void> local_130 [2];
  SourceLocation local_120;
  Promise<void> local_108;
  bool local_fc;
  bool local_fb;
  DebugExpression<bool> local_fa [2];
  undefined1 auStack_f8 [4];
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  Promise<void> local_e0;
  undefined1 *local_d8;
  Type local_d0;
  Promise<void> local_c8;
  Promise<void> promise;
  undefined1 local_b0 [8];
  WaitScope waitScope;
  EventLoop loop;
  bool called;
  TestCase1294 *this_local;
  
  loop.currentlyFiring._7_1_ = 0;
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_b0,(EventLoop *)&waitScope.runningStacksPool);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&local_d0);
  local_d8 = (undefined1 *)((long)&loop.currentlyFiring + 7);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase1294::run()::__0>(&local_c8,&local_d0);
  Promise<void>::~Promise((Promise<void> *)&local_d0);
  yield();
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x517,3);
  Promise<void>::wait(&local_e0,local_b0);
  Promise<void>::~Promise(&local_e0);
  local_fb = (bool)(~loop.currentlyFiring._7_1_ & 1);
  local_fa[0] = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_fb);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_fa);
  if (!bVar1) {
    local_fc = kj::_::Debug::shouldLog(ERROR);
    while (local_fc != false) {
      kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x519,ERROR,"\"failed: expected \" \"!(called)\", _kjCondition",
                 (char (*) [27])"failed: expected !(called)",local_fa);
      local_fc = false;
    }
  }
  SourceLocation::SourceLocation
            (&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x51b,0xd);
  location.function = local_120.function;
  location.fileName = local_120.fileName;
  location.lineNumber = local_120.lineNumber;
  location.columnNumber = local_120.columnNumber;
  Promise<void>::eagerlyEvaluate(&local_108,&local_c8,location);
  Promise<void>::operator=(&local_c8,&local_108);
  Promise<void>::~Promise(&local_108);
  yield();
  SourceLocation::SourceLocation
            (&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x51d,3);
  Promise<void>::wait(local_130,local_b0);
  Promise<void>::~Promise(local_130);
  DStack_158 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&loop.currentlyFiring + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffffea8)
  ;
  if (!bVar1) {
    local_159 = kj::_::Debug::shouldLog(ERROR);
    while (local_159 != false) {
      kj::_::Debug::log<char_const(&)[24],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x51f,ERROR,"\"failed: expected \" \"called\", _kjCondition",
                 (char (*) [24])"failed: expected called",&stack0xfffffffffffffea8);
      local_159 = false;
    }
  }
  Promise<void>::~Promise(&local_c8);
  WaitScope::~WaitScope((WaitScope *)local_b0);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, EagerlyEvaluate) {
  bool called = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = Promise<void>(READY_NOW).then([&]() {
    called = true;
  });
  yield().wait(waitScope);

  EXPECT_FALSE(called);

  promise = promise.eagerlyEvaluate(nullptr);

  yield().wait(waitScope);

  EXPECT_TRUE(called);
}